

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O1

Rwr_Node_t *
Rwr_ManTryNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  Rwr_Node_t **ppRVar1;
  Vec_Ptr_t *pVVar2;
  Rwr_Node_t *pRVar3;
  uint uVar4;
  Rwr_Node_t *pRVar5;
  void **ppvVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  Rwr_Node_t *pRVar10;
  int iVar11;
  Rwr_Node_t **ppRVar12;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar8 = *(uint *)&p0->field_0xe;
    }
    else {
      uVar8 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 0xe);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar4 = *(uint *)&p1->field_0xe;
    }
    else {
      uVar4 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0xe);
    }
    uVar4 = uVar4 & uVar8;
  }
  else {
    uVar4 = *(uint *)&p1->field_0xe ^ *(uint *)&p0->field_0xe;
  }
  pRVar5 = (Rwr_Node_t *)(ulong)uVar4;
  uVar7 = (ulong)pRVar5 & 0xffff;
  if ((2 < Level) && (p->pPractical[p->puCanons[uVar7]] == '\0')) {
    return pRVar5;
  }
  ppRVar1 = p->pTable + uVar7;
  pRVar3 = *ppRVar1;
  ppRVar12 = ppRVar1;
  if (*ppRVar1 != (Rwr_Node_t *)0x0) {
    do {
      pRVar10 = pRVar3;
      uVar8 = *(uint *)&pRVar10->field_0xe;
      uVar9 = uVar8 >> 0x18 & 0x3f;
      if ((uVar9 < (uint)Level) && ((uVar8 >> 0x10 & 0xff) < (uint)Volume)) {
        return pRVar5;
      }
      if ((uVar9 == Level) && ((uVar8 >> 0x10 & 0xff) < (uint)Volume)) {
        return pRVar5;
      }
      pRVar3 = pRVar10->pNext;
    } while (pRVar10->pNext != (Rwr_Node_t *)0x0);
    ppRVar12 = &pRVar10->pNext;
  }
  if ((*ppRVar1 == (Rwr_Node_t *)0x0) && (p->puCanons[uVar7] == (unsigned_short)uVar4)) {
    p->nClasses = p->nClasses + 1;
  }
  pRVar5 = (Rwr_Node_t *)Extra_MmFixedEntryFetch(p->pMmNode);
  pRVar5->Id = p->vForest->nSize;
  pRVar5->TravId = 0;
  *(uint *)&pRVar5->field_0xe =
       (uint)uVar7 | fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18;
  pRVar5->p0 = p0;
  pRVar5->p1 = p1;
  pRVar5->pNext = (Rwr_Node_t *)0x0;
  pVVar2 = p->vForest;
  uVar8 = pVVar2->nCap;
  if (pVVar2->nSize == uVar8) {
    if ((int)uVar8 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar11 = 0x10;
    }
    else {
      iVar11 = uVar8 * 2;
      if (iVar11 <= (int)uVar8) goto LAB_008c4732;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar8 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar11;
  }
LAB_008c4732:
  pRVar3 = (Rwr_Node_t *)pVVar2->pArray;
  iVar11 = pVVar2->nSize;
  pVVar2->nSize = iVar11 + 1;
  *(Rwr_Node_t **)(&pRVar3->Id + (long)iVar11 * 2) = pRVar5;
  *ppRVar12 = pRVar5;
  return pRVar3;
}

Assistant:

Rwr_Node_t * Rwr_ManTryNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pOld, * pNew, ** ppPlace;
    unsigned uTruth;
    // compute truth table, level, volume
    p->nConsidered++;
    if ( fExor )
    {
//        printf( "Considering EXOR of %d and %d.\n", p0->Id, p1->Id );
        uTruth = (p0->uTruth ^ p1->uTruth);
    }
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // skip non-practical classes
    if ( Level > 2 && !p->pPractical[p->puCanons[uTruth]] )
        return NULL;
    // enumerate through the nodes with the same canonical form
    ppPlace = p->pTable + uTruth;
    for ( pOld = *ppPlace; pOld; ppPlace = &pOld->pNext, pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
/*
    // enumerate through the nodes with the opposite polarity
    for ( pOld = p->pTable[~uTruth & 0xFFFF]; pOld; pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
*/
    // count the classes
    if ( p->pTable[uTruth] == NULL && p->puCanons[uTruth] == uTruth )
        p->nClasses++;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    *ppPlace     = pNew;
    return pNew;
}